

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.h
# Opt level: O0

void __thiscall
wabt::ReadBinaryOptions::ReadBinaryOptions
          (ReadBinaryOptions *this,Features *features,Stream *log_stream,bool read_debug_names,
          bool stop_on_first_error,bool fail_on_custom_section_error)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool fail_on_custom_section_error_local;
  bool stop_on_first_error_local;
  bool read_debug_names_local;
  Stream *log_stream_local;
  Features *features_local;
  ReadBinaryOptions *this_local;
  
  bVar1 = features->mutable_globals_enabled_;
  bVar2 = features->sat_float_to_int_enabled_;
  bVar3 = features->sign_extension_enabled_;
  bVar4 = features->simd_enabled_;
  bVar5 = features->threads_enabled_;
  bVar6 = features->function_references_enabled_;
  bVar7 = features->multi_value_enabled_;
  (this->features).exceptions_enabled_ = features->exceptions_enabled_;
  (this->features).mutable_globals_enabled_ = bVar1;
  (this->features).sat_float_to_int_enabled_ = bVar2;
  (this->features).sign_extension_enabled_ = bVar3;
  (this->features).simd_enabled_ = bVar4;
  (this->features).threads_enabled_ = bVar5;
  (this->features).function_references_enabled_ = bVar6;
  (this->features).multi_value_enabled_ = bVar7;
  bVar1 = features->bulk_memory_enabled_;
  bVar2 = features->reference_types_enabled_;
  bVar3 = features->annotations_enabled_;
  bVar4 = features->code_metadata_enabled_;
  bVar5 = features->gc_enabled_;
  bVar6 = features->memory64_enabled_;
  bVar7 = features->multi_memory_enabled_;
  (this->features).tail_call_enabled_ = features->tail_call_enabled_;
  (this->features).bulk_memory_enabled_ = bVar1;
  (this->features).reference_types_enabled_ = bVar2;
  (this->features).annotations_enabled_ = bVar3;
  (this->features).code_metadata_enabled_ = bVar4;
  (this->features).gc_enabled_ = bVar5;
  (this->features).memory64_enabled_ = bVar6;
  (this->features).multi_memory_enabled_ = bVar7;
  bVar1 = features->relaxed_simd_enabled_;
  (this->features).extended_const_enabled_ = features->extended_const_enabled_;
  (this->features).relaxed_simd_enabled_ = bVar1;
  this->log_stream = log_stream;
  this->read_debug_names = read_debug_names;
  this->stop_on_first_error = stop_on_first_error;
  this->fail_on_custom_section_error = fail_on_custom_section_error;
  this->skip_function_bodies = false;
  return;
}

Assistant:

ReadBinaryOptions(const Features& features,
                    Stream* log_stream,
                    bool read_debug_names,
                    bool stop_on_first_error,
                    bool fail_on_custom_section_error)
      : features(features),
        log_stream(log_stream),
        read_debug_names(read_debug_names),
        stop_on_first_error(stop_on_first_error),
        fail_on_custom_section_error(fail_on_custom_section_error) {}